

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

void CSOAA::do_actual_learning<true>(ldf *data,single_learner *base,multi_ex *ec_seq_all)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  pointer ppeVar3;
  example *peVar4;
  action_score *paVar5;
  v_array<ACTION_SCORE::action_score> *pvVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  action_score *paVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ldf *plVar14;
  bool bVar15;
  bool bVar16;
  vw_exception *this;
  uint32_t uVar17;
  ulong uVar18;
  long lVar19;
  size_t k;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  uint uVar25;
  ulong start_K;
  float fVar26;
  float fVar27;
  multi_ex ec_seq;
  stringstream __msg;
  multi_ex local_208;
  v_array<v_array<ACTION_SCORE::action_score>_> *local_1f0;
  ldf *local_1e8;
  v_array<ACTION_SCORE::action_score> *local_1e0;
  string local_1d8;
  action_score local_1b8 [2];
  ostream local_1a8;
  
  ppeVar3 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar3) {
    data->ft_offset = ((*ppeVar3)->super_example_predict).ft_offset;
    process_labels(&local_208,data,ec_seq_all);
    ppeVar3 = local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar21 = (long)local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar21 != 0) {
      bVar15 = ec_seq_has_label_definition(&local_208);
      if (bVar15) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"error: label definition encountered in data block",0x31);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                   ,0x1b6,&local_1d8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      bVar15 = COST_SENSITIVE::ec_is_example_header(*ppeVar3);
      uVar22 = lVar21 >> 3;
      start_K = 0;
      uVar20 = (uint)uVar22;
      if ((bVar15) && (start_K = 1, 1 < uVar20)) {
        uVar23 = 1;
        do {
          LabelDict::add_example_namespaces_from_example
                    (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar23],
                     *local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
          uVar23 = uVar23 + 1;
        } while ((uVar22 & 0xffffffff) != uVar23);
      }
      uVar25 = (uint)start_K;
      bVar16 = test_ldf_sequence(data,start_K,&local_208);
      uVar23 = start_K;
      local_1e8 = data;
      if (data->rank == false) {
        if (uVar25 < uVar20) {
          fVar27 = 3.4028235e+38;
          sVar24 = start_K;
          do {
            local_1f0 = (v_array<v_array<ACTION_SCORE::action_score>_> *)
                        CONCAT44(local_1f0._4_4_,fVar27);
            peVar4 = local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar24];
            make_single_prediction(data,base,peVar4);
            fVar26 = peVar4->partial_prediction;
            fVar27 = local_1f0._0_4_;
            if (fVar26 < local_1f0._0_4_) {
              uVar23 = sVar24 & 0xffffffff;
              fVar27 = fVar26;
            }
            sVar24 = sVar24 + 1;
          } while ((uVar22 & 0xffffffff) != sVar24);
        }
      }
      else {
        local_1e0 = &data->a_s;
        v_array<ACTION_SCORE::action_score>::clear(local_1e0);
        local_1f0 = &data->stored_preds;
        v_array<v_array<ACTION_SCORE::action_score>_>::clear(local_1f0);
        if (bVar15) {
          v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                    (local_1f0,
                     (v_array<ACTION_SCORE::action_score> *)
                     &((*local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->pred).scalars);
        }
        if (uVar25 < uVar20) {
          uVar17 = 0;
          sVar24 = start_K;
          do {
            v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                      (local_1f0,
                       (v_array<ACTION_SCORE::action_score> *)
                       &(local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
                         .super__Vector_impl_data._M_start[sVar24]->pred).scalars);
            peVar4 = local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar24];
            make_single_prediction(local_1e8,base,peVar4);
            local_1b8[0].score = peVar4->partial_prediction;
            local_1b8[0].action = uVar17;
            v_array<ACTION_SCORE::action_score>::push_back(local_1e0,local_1b8);
            sVar24 = sVar24 + 1;
            uVar17 = uVar17 + 1;
          } while ((uVar22 & 0xffffffff) != sVar24);
        }
        data = local_1e8;
        paVar5 = (local_1e8->a_s)._begin;
        qsort(paVar5,(long)(local_1e8->a_s)._end - (long)paVar5 >> 3,8,ACTION_SCORE::score_comp);
      }
      if (!bVar16) {
        if (data->is_wap == true) {
          do_actual_learning_wap(data,base,start_K,&local_208);
        }
        else {
          do_actual_learning_oaa(data,base,start_K,&local_208);
        }
      }
      if (data->rank == false) {
        uVar18 = start_K;
        if (start_K < (uVar22 & 0xffffffff)) {
          do {
            fVar27 = 0.0;
            if (uVar23 == uVar18) {
              fVar27 = (float)((local_208.super__Vector_base<example_*,_std::allocator<example_*>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar18]->l).cs.costs._begin
                              )->class_index;
            }
            (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar18]->pred).scalar = fVar27;
            uVar18 = uVar18 + 1;
          } while ((uVar22 & 0xffffffff) != uVar18);
        }
      }
      else {
        v_array<ACTION_SCORE::action_score>::clear((data->stored_preds)._begin);
        if (bVar15) {
          pvVar6 = (data->stored_preds)._begin;
          peVar4 = *local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          paVar5 = pvVar6->_begin;
          paVar11 = pvVar6->_end;
          uVar8 = *(undefined4 *)((long)&pvVar6->end_array + 4);
          sVar24 = pvVar6->erase_count;
          uVar9 = *(undefined4 *)((long)&pvVar6->erase_count + 4);
          *(undefined4 *)((long)&peVar4->pred + 0x10) = *(undefined4 *)&pvVar6->end_array;
          *(undefined4 *)((long)&peVar4->pred + 0x14) = uVar8;
          *(int *)((long)&peVar4->pred + 0x18) = (int)sVar24;
          *(undefined4 *)((long)&peVar4->pred + 0x1c) = uVar9;
          (peVar4->pred).scalars._begin = (float *)paVar5;
          (peVar4->pred).scalars._end = (float *)paVar11;
        }
        lVar21 = (uVar22 & 0xffffffff) - start_K;
        if (start_K <= (uVar22 & 0xffffffff) && lVar21 != 0) {
          lVar19 = 0;
          do {
            pvVar6 = (local_1e8->stored_preds)._begin;
            lVar7 = *(long *)((long)local_208.
                                    super__Vector_base<example_*,_std::allocator<example_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start +
                             lVar19 + (ulong)(uVar25 * 8));
            puVar1 = (undefined8 *)((long)&pvVar6->_begin + lVar19 * 4 + (ulong)(uVar25 << 5));
            uVar12 = *puVar1;
            uVar13 = puVar1[1];
            puVar2 = (undefined4 *)((long)&pvVar6->end_array + lVar19 * 4 + (ulong)(uVar25 << 5));
            uVar8 = puVar2[1];
            uVar9 = puVar2[2];
            uVar10 = puVar2[3];
            *(undefined4 *)(lVar7 + 0x6860) = *puVar2;
            *(undefined4 *)(lVar7 + 0x6864) = uVar8;
            *(undefined4 *)(lVar7 + 0x6868) = uVar9;
            *(undefined4 *)(lVar7 + 0x686c) = uVar10;
            *(undefined8 *)(lVar7 + 0x6850) = uVar12;
            *(undefined8 *)(lVar7 + 0x6858) = uVar13;
            v_array<ACTION_SCORE::action_score>::push_back
                      ((v_array<ACTION_SCORE::action_score> *)
                       &((*local_208.super__Vector_base<example_*,_std::allocator<example_*>_>.
                           _M_impl.super__Vector_impl_data._M_start)->pred).scalars,
                       (action_score *)((long)&((local_1e8->a_s)._begin)->action + lVar19));
            lVar19 = lVar19 + 8;
            lVar21 = lVar21 + -1;
          } while (lVar21 != 0);
        }
      }
      plVar14 = local_1e8;
      if ((bVar15) && (1 < (uVar22 & 0xffffffff))) {
        uVar23 = 1;
        do {
          LabelDict::del_example_namespaces_from_example
                    (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar23],
                     *local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
          uVar23 = uVar23 + 1;
        } while ((uVar22 & 0xffffffff) != uVar23);
      }
      if (plVar14->is_probabilities == true) {
        uVar22 = uVar22 & 0xffffffff;
        fVar27 = 0.0;
        uVar23 = start_K;
        if (start_K < uVar22) {
          do {
            fVar26 = expf(local_208.super__Vector_base<example_*,_std::allocator<example_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar23]->partial_prediction);
            fVar26 = 1.0 / (fVar26 + 1.0);
            (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar23]->pred).scalar = fVar26;
            fVar27 = fVar27 + fVar26;
            uVar23 = uVar23 + 1;
          } while (uVar22 != uVar23);
        }
        if (uVar25 < uVar20) {
          do {
            (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
             super__Vector_impl_data._M_start[start_K]->pred).scalar =
                 (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                  super__Vector_impl_data._M_start[start_K]->pred).scalar / fVar27;
            start_K = start_K + 1;
          } while (uVar22 != start_K);
        }
      }
    }
    if (local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void do_actual_learning(ldf& data, single_learner& base, multi_ex& ec_seq_all)
{
  if (ec_seq_all.size() == 0)
    return;  // nothing to do

  data.ft_offset = ec_seq_all[0]->ft_offset;

  // handle label definitions
  auto ec_seq = process_labels(data, ec_seq_all);
  if (ec_seq.size() == 0)
    return;  // nothing more to do

  // Ensure there are no more labels
  // (can be done in existing loops later but as a side effect learning
  //    will happen with bad example)
  if (ec_seq_has_label_definition(ec_seq))
  {
    THROW("error: label definition encountered in data block");
  }

  /////////////////////// add headers
  uint32_t K = (uint32_t)ec_seq.size();
  uint32_t start_K = 0;

  if (ec_is_example_header(*ec_seq[0]))
  {
    start_K = 1;
    for (uint32_t k = 1; k < K; k++) LabelDict::add_example_namespaces_from_example(*ec_seq[k], *ec_seq[0]);
  }
  bool isTest = test_ldf_sequence(data, start_K, ec_seq);
  /////////////////////// do prediction
  uint32_t predicted_K = start_K;
  if (data.rank)
  {
    data.a_s.clear();
    data.stored_preds.clear();
    if (start_K > 0)
      data.stored_preds.push_back(ec_seq[0]->pred.a_s);
    for (uint32_t k = start_K; k < K; k++)
    {
      data.stored_preds.push_back(ec_seq[k]->pred.a_s);
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      action_score s;
      s.score = ec->partial_prediction;
      s.action = k - start_K;
      data.a_s.push_back(s);
    }

    qsort((void*)data.a_s.begin(), data.a_s.size(), sizeof(action_score), score_comp);
  }
  else
  {
    float min_score = FLT_MAX;
    for (uint32_t k = start_K; k < K; k++)
    {
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      if (ec->partial_prediction < min_score)
      {
        min_score = ec->partial_prediction;
        predicted_K = k;
      }
    }
  }

  /////////////////////// learn
  if (is_learn && !isTest)
  {
    if (data.is_wap)
      do_actual_learning_wap(data, base, start_K, ec_seq);
    else
      do_actual_learning_oaa(data, base, start_K, ec_seq);
  }

  if (data.rank)
  {
    data.stored_preds[0].clear();
    if (start_K > 0)
    {
      ec_seq[0]->pred.a_s = data.stored_preds[0];
    }
    for (size_t k = start_K; k < K; k++)
    {
      ec_seq[k]->pred.a_s = data.stored_preds[k];
      ec_seq[0]->pred.a_s.push_back(data.a_s[k - start_K]);
    }
  }
  else
  {
    // Mark the predicted subexample with its class_index, all other with 0
    for (size_t k = start_K; k < K; k++)
    {
      if (k == predicted_K)
        ec_seq[k]->pred.multiclass = ec_seq[k]->l.cs.costs[0].class_index;
      else
        ec_seq[k]->pred.multiclass = 0;
    }
  }
  /////////////////////// remove header
  if (start_K > 0)
    for (size_t k = 1; k < K; k++) LabelDict::del_example_namespaces_from_example(*ec_seq[k], *ec_seq[0]);

  ////////////////////// compute probabilities
  if (data.is_probabilities)
  {
    float sum_prob = 0;
    for (size_t k = start_K; k < K; k++)
    {
      // probability(correct_class) = 1 / (1+exp(-score)), where score is higher for better classes,
      // but partial_prediction is lower for better classes (we are predicting the cost),
      // so we need to take score = -partial_prediction,
      // thus probability(correct_class) = 1 / (1+exp(-(-partial_prediction)))
      float prob = 1.f / (1.f + correctedExp(ec_seq[k]->partial_prediction));
      ec_seq[k]->pred.prob = prob;
      sum_prob += prob;
    }
    // make sure that the probabilities sum up (exactly) to one
    for (size_t k = start_K; k < K; k++)
    {
      ec_seq[k]->pred.prob /= sum_prob;
    }
  }
}